

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O3

int dwarf_formblock(Dwarf_Attribute attr,Dwarf_Block **return_block,Dwarf_Error *error)

{
  Dwarf_Debug dbg_00;
  int iVar1;
  Dwarf_Block *pDVar2;
  int iVar3;
  Dwarf_Debug dbg;
  Dwarf_CU_Context_conflict cu_context;
  Dwarf_Block local_block;
  Dwarf_Debug local_58;
  Dwarf_CU_Context_conflict local_50;
  Dwarf_Block local_48;
  
  local_50 = (Dwarf_CU_Context_conflict)0x0;
  local_58 = (Dwarf_Debug)0x0;
  local_48.bl_from_loclist = '\0';
  local_48._17_7_ = 0;
  local_48.bl_section_offset = 0;
  local_48.bl_len = 0;
  local_48.bl_data = (Dwarf_Ptr)0x0;
  iVar1 = get_attr_dbg(&local_58,&local_50,attr,error);
  dbg_00 = local_58;
  iVar3 = 1;
  if (iVar1 == 0) {
    iVar1 = _dwarf_formblock_internal(local_58,attr,local_50,&local_48,error);
    if (iVar1 == 0) {
      pDVar2 = (Dwarf_Block *)_dwarf_get_alloc(dbg_00,'\x06',1);
      if (pDVar2 == (Dwarf_Block *)0x0) {
        _dwarf_error(dbg_00,error,0x3e);
      }
      else {
        pDVar2->bl_from_loclist = local_48.bl_from_loclist;
        *(undefined7 *)&pDVar2->field_0x11 = local_48._17_7_;
        pDVar2->bl_section_offset = local_48.bl_section_offset;
        pDVar2->bl_len = local_48.bl_len;
        pDVar2->bl_data = local_48.bl_data;
        *return_block = pDVar2;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int
dwarf_formblock(Dwarf_Attribute attr,
    Dwarf_Block ** return_block, Dwarf_Error * error)
{
    Dwarf_CU_Context cu_context = 0;
    Dwarf_Debug dbg = 0;
    Dwarf_Block local_block;
    Dwarf_Block *out_block = 0;
    int res = 0;

    memset(&local_block,0,sizeof(local_block));
    res  = get_attr_dbg(&dbg,&cu_context,attr,error);
    if (res != DW_DLV_OK) {
        return res;
    }
    res = _dwarf_formblock_internal(dbg,attr,
        cu_context, &local_block, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    out_block = (Dwarf_Block *)
        _dwarf_get_alloc(dbg, DW_DLA_BLOCK, 1);
    if (!out_block) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        return DW_DLV_ERROR;
    }
    *out_block = local_block;
    *return_block = out_block;
    return DW_DLV_OK;
}